

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::AllocateVertex
          (ON_SubD_FixedSizeHeap *this,double *vertexP,uint edge_capacity)

{
  uint uVar1;
  ON_SubDVertex *v;
  ON__UINT_PTR *a;
  uint face_capacity;
  uint edge_capacity_local;
  double *vertexP_local;
  ON_SubD_FixedSizeHeap *this_local;
  
  if ((this->m_v == (ON_SubDVertex *)0x0) || (this->m_v_capacity <= this->m_v_index)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else if (this->m_p_capacity < edge_capacity * 2 + this->m_p_index) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubD_FixedSizeHeap *)0x0;
  }
  else {
    v = (ON_SubDVertex *)0x0;
    if (edge_capacity != 0) {
      if (0xffff < edge_capacity) {
        ON_SubDIncrementErrorCount();
        return (ON_SubDVertex *)0x0;
      }
      if (0xffff < edge_capacity) {
        ON_SubDIncrementErrorCount();
        return (ON_SubDVertex *)0x0;
      }
      v = (ON_SubDVertex *)AllocatePtrArray(this,edge_capacity * 2,true);
      if (v == (ON_SubDVertex *)0x0) {
        ON_SubDIncrementErrorCount();
        return (ON_SubDVertex *)0x0;
      }
    }
    this_local = (ON_SubD_FixedSizeHeap *)(this->m_v + this->m_v_index);
    memset(this_local,0,0x108);
    if (this->m_v_index != 0) {
      this->m_v[this->m_v_index - 1].m_next_vertex = (ON_SubDVertex *)this_local;
      ((ON_SubDVertex *)this_local)->m_prev_vertex = this->m_v + (this->m_v_index - 1);
    }
    uVar1 = this->m_v_index + 1;
    this->m_v_index = uVar1;
    (((ON_SubDVertex *)this_local)->super_ON_SubDComponentBase).m_id = uVar1;
    if (vertexP != (double *)0x0) {
      ((ON_SubDVertex *)this_local)->m_P[0] = *vertexP;
      ((ON_SubDVertex *)this_local)->m_P[1] = vertexP[1];
      ((ON_SubDVertex *)this_local)->m_P[2] = vertexP[2];
    }
    if (edge_capacity != 0) {
      ((ON_SubDVertex *)this_local)->m_edge_capacity = (unsigned_short)edge_capacity;
      ((ON_SubDVertex *)this_local)->m_edges = (ON_SubDEdgePtr *)v;
      ((ON_SubDVertex *)this_local)->m_face_capacity = (unsigned_short)edge_capacity;
      ((ON_SubDVertex *)this_local)->m_faces =
           (ON_SubDFace **)
           ((v->super_ON_SubDComponentBase).m_saved_subd_point1 + ((ulong)edge_capacity - 3));
    }
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

ON_SubDVertex* ON_SubD_FixedSizeHeap::AllocateVertex(
  const double vertexP[3],
  unsigned int edge_capacity
  )
{
  if (nullptr == m_v || m_v_index >= m_v_capacity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const unsigned int face_capacity = edge_capacity;

  if (edge_capacity + face_capacity + m_p_index > m_p_capacity )
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON__UINT_PTR* a = nullptr;
  if (0 != edge_capacity || 0 != face_capacity)
  {
    if ( edge_capacity > 0xFFFFu)
      return ON_SUBD_RETURN_ERROR(nullptr);
    if ( face_capacity > 0xFFFFu)
      return ON_SUBD_RETURN_ERROR(nullptr);
    a = AllocatePtrArray(edge_capacity + face_capacity, true);
    if (nullptr == a)
      return ON_SUBD_RETURN_ERROR(nullptr);
  }

  ON_SubDVertex* v = m_v + m_v_index;
  memset(v, 0, sizeof(*v));
  if (m_v_index > 0)
  {
    // code in ON_SubDFaceNeighborhood.Subdivide() relies on
    // m_next_vertex being set this way.
    m_v[m_v_index - 1].m_next_vertex = v;
    v->m_prev_vertex = &m_v[m_v_index - 1];
  }
  v->m_id = ++m_v_index;

  if (nullptr != vertexP)
  {
    v->m_P[0] = vertexP[0];
    v->m_P[1] = vertexP[1];
    v->m_P[2] = vertexP[2];
  }

  if (edge_capacity > 0)
  {
    v->m_edge_capacity = (unsigned short)edge_capacity;
    v->m_edges = (ON_SubDEdgePtr*)a;
    a += edge_capacity;
  }
  if (face_capacity > 0)
  {
    v->m_face_capacity = (unsigned short)face_capacity;
    v->m_faces = (const ON_SubDFace**)a;
  }
  a = 0;

  return v;
}